

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::SubtractTimes(Bignum *this,Bignum *other,int factor)

{
  uint uVar1;
  int iVar2;
  Vector<unsigned_int> *this_00;
  uint *puVar3;
  ulong uVar4;
  int index;
  uint uVar5;
  int i;
  int index_00;
  bool bVar6;
  
  iVar2 = other->exponent_ - this->exponent_;
  if (other->exponent_ < this->exponent_) {
    __assert_fail("exponent_ <= other.exponent_",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x2e3,"void FIX::double_conversion::Bignum::SubtractTimes(const Bignum &, int)");
  }
  if (factor < 3) {
    iVar2 = 0;
    if (0 < factor) {
      iVar2 = factor;
    }
    while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
      SubtractBignum(this,other);
    }
  }
  else {
    this_00 = &this->bigits_;
    uVar5 = 0;
    for (index_00 = 0; index_00 < other->used_digits_; index_00 = index_00 + 1) {
      puVar3 = Vector<unsigned_int>::operator[](&other->bigits_,index_00);
      uVar4 = (ulong)uVar5 + (ulong)*puVar3 * (ulong)(uint)factor;
      index = iVar2 + index_00;
      puVar3 = Vector<unsigned_int>::operator[](this_00,index);
      uVar5 = *puVar3 - ((uint)uVar4 & 0xfffffff);
      puVar3 = Vector<unsigned_int>::operator[](this_00,index);
      *puVar3 = uVar5 & 0xfffffff;
      uVar5 = (int)(uVar4 >> 0x1c) - ((int)uVar5 >> 0x1f);
    }
    iVar2 = other->used_digits_ + iVar2;
    while( true ) {
      if (this->used_digits_ <= iVar2) {
        Clamp(this);
        return;
      }
      if (uVar5 == 0) break;
      puVar3 = Vector<unsigned_int>::operator[](this_00,iVar2);
      uVar1 = *puVar3;
      puVar3 = Vector<unsigned_int>::operator[](this_00,iVar2);
      *puVar3 = uVar1 - uVar5 & 0xfffffff;
      uVar5 = uVar1 - uVar5 >> 0x1f;
      iVar2 = iVar2 + 1;
    }
  }
  return;
}

Assistant:

void Bignum::SubtractTimes(const Bignum& other, int factor) {
  ASSERT(exponent_ <= other.exponent_);
  if (factor < 3) {
    for (int i = 0; i < factor; ++i) {
      SubtractBignum(other);
    }
    return;
  }
  Chunk borrow = 0;
  int exponent_diff = other.exponent_ - exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * other.bigits_[i];
    DoubleChunk remove = borrow + product;
    Chunk difference = bigits_[i + exponent_diff] - (remove & kBigitMask);
    bigits_[i + exponent_diff] = difference & kBigitMask;
    borrow = static_cast<Chunk>((difference >> (kChunkSize - 1)) +
                                (remove >> kBigitSize));
  }
  for (int i = other.used_digits_ + exponent_diff; i < used_digits_; ++i) {
    if (borrow == 0) return;
    Chunk difference = bigits_[i] - borrow;
    bigits_[i] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  Clamp();
}